

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

char * __thiscall
CVmImageFileMem::alloc_and_read(CVmImageFileMem *this,size_t len,uchar xor_mask,ulong param_3)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = this->pos_;
  uVar2 = len + lVar1;
  if (this->len_ < uVar2) {
    err_throw(0x12f);
  }
  this->pos_ = uVar2;
  if (xor_mask == '\0') {
    return this->mem_ + lVar1;
  }
  err_throw(0x144);
}

Assistant:

const char *CVmImageFileMem::alloc_and_read(size_t len, uchar xor_mask,
                                            ulong /*remaining_in_page*/)
{
    const char *ret;
    
    /* if we're past the end of the file, throw an error */
    if (pos_ + len > len_)
        err_throw(VMERR_READ_PAST_IMG_END);

    /* the data are already in memory - figure out where */
    ret = mem_ + pos_;

    /* seek past the data */
    pos_ += len;

    /* 
     *   we can't apply an xor mask to an in-memory page - if the mask is
     *   non-zero, it's an error 
     */
    if (xor_mask != 0)
        err_throw(VMERR_XOR_MASK_BAD_IN_MEM);

    /* return the pointer */
    return ret;
}